

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alert_manager.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::alert_manager::alert_manager
          (alert_manager *this,int queue_limit,alert_category_t alert_mask)

{
  int queue_limit_local;
  alert_manager *this_local;
  alert_category_t alert_mask_local;
  
  ::std::recursive_mutex::recursive_mutex(&this->m_mutex);
  ::std::_V2::condition_variable_any::condition_variable_any(&this->m_condition);
  ::std::
  atomic<libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::alert_category_tag,_void>_>::
  atomic(&this->m_alert_mask,
         (bitfield_flag<unsigned_int,_libtorrent::alert_category_tag,_void>)alert_mask.m_val);
  this->m_queue_size_limit = queue_limit;
  ::std::bitset<128UL>::bitset(&this->m_dropped);
  ::std::function<void_()>::function(&this->m_notify);
  this->m_generation = 0;
  container_wrapper<libtorrent::heterogeneous_queue<libtorrent::alert>,_long,_std::array<libtorrent::heterogeneous_queue<libtorrent::alert>,_2UL>_>
  ::container_wrapper(&this->m_alerts);
  container_wrapper<libtorrent::aux::stack_allocator,_long,_std::array<libtorrent::aux::stack_allocator,_2UL>_>
  ::container_wrapper(&this->m_allocations);
  ::std::__cxx11::
  list<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>::
  list(&this->m_ses_extensions);
  return;
}

Assistant:

alert_manager::alert_manager(int const queue_limit, alert_category_t const alert_mask)
		: m_alert_mask(alert_mask)
		, m_queue_size_limit(queue_limit)
	{}